

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O3

HT_TaskId ht_task_scheduler_schedule_task
                    (HT_TaskScheduler *task_scheduler,HT_TaskSchedulingMode mode,
                    HT_DurationNs period,HT_TaskCallback callback,void *user_data)

{
  int iVar1;
  HT_ErrorCode HVar2;
  undefined8 *data;
  HT_TimestampNs HVar3;
  HT_TaskId HVar4;
  
  HVar4 = -1;
  if ((callback != (HT_TaskCallback)0x0) && (task_scheduler->next_task_id != 0x7fffffff)) {
    data = (undefined8 *)ht_alloc(0x28);
    if (data != (undefined8 *)0x0) {
      *data = callback;
      data[1] = user_data;
      data[2] = period;
      HVar3 = ht_monotonic_clock_get_timestamp();
      data[3] = HVar3 + period;
      iVar1 = task_scheduler->next_task_id;
      task_scheduler->next_task_id = iVar1 + 1;
      *(int *)(data + 4) = iVar1;
      *(HT_TaskSchedulingMode *)((long)data + 0x24) = mode;
      HVar2 = ht_bag_void_ptr_add(&task_scheduler->tasks,data);
      if (HVar2 == HT_ERR_OK) {
        HVar4 = *(HT_TaskId *)(data + 4);
      }
    }
  }
  return HVar4;
}

Assistant:

HT_TaskId
ht_task_scheduler_schedule_task(HT_TaskScheduler* task_scheduler,
                                HT_TaskSchedulingMode mode,
                                HT_DurationNs period,
                                HT_TaskCallback callback,
                                void* user_data)
{
    HT_Task* task;

    if (task_scheduler->next_task_id == HT_INT32_MAX || callback == NULL)
    {
        return HT_TASK_SCHEDULER_INVALID_TASK_ID;
    }

    task = HT_CREATE_TYPE(HT_Task);
    if (task == NULL)
    {
        return HT_TASK_SCHEDULER_INVALID_TASK_ID;
    }

    task->callback = callback;
    task->user_data = user_data;
    task->period = period;
    task->next_action_ts = ht_monotonic_clock_get_timestamp() + period;
    task->id = task_scheduler->next_task_id++;
    task->mode = mode;

    if (ht_bag_void_ptr_add(&task_scheduler->tasks, task) != HT_ERR_OK)
    {
        return HT_TASK_SCHEDULER_INVALID_TASK_ID;
    }

    return task->id;
}